

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

uint Cudd_Prime(uint p)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar3 = p - 1;
  while( true ) {
    do {
      uVar4 = uVar3 + 1;
      uVar1 = uVar3 & 1;
      uVar3 = uVar4;
    } while (uVar1 != 0);
    if (uVar4 < 9) break;
    uVar2 = 3;
    while ((int)((ulong)uVar4 % uVar2) != 0) {
      uVar1 = (int)uVar2 + 2;
      uVar2 = (ulong)uVar1;
      if (uVar4 < uVar1 * uVar1) {
        return uVar4;
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned int
Cudd_Prime(
  unsigned int  p)
{
    int i,pn;

    p--;
    do {
        p++;
        if (p&1) {
            pn = 1;
            i = 3;
            while ((unsigned) (i * i) <= p) {
                if (p % i == 0) {
                    pn = 0;
                    break;
                }
                i += 2;
            }
        } else {
            pn = 0;
        }
    } while (!pn);
    return(p);

}